

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::print_recursive_json
          (StackNode *this,ostream *os,StackNode *parent,double tree_time)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  bool bVar6;
  _Setprecision _Var7;
  ulong uVar8;
  ostream *poVar9;
  reference pSVar10;
  reference ppSVar11;
  double dVar12;
  StackNode *child_2;
  _Self local_158;
  iterator it;
  iterator last;
  reference local_138;
  reference local_130;
  StackNode *child_1;
  iterator __end2;
  iterator __begin2;
  set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  *__range2;
  undefined1 local_108 [8];
  set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  children_by_time;
  anon_class_1_0_00000001_for__M_key_compare by_time;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_c8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_escape_double_quote_twices;
  double kps;
  double remainder;
  StackNode *child;
  iterator __end4;
  iterator __begin4;
  set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  *__range4;
  double child_runtime;
  double percent_kokkos;
  double imbalance;
  double percent;
  double tree_time_local;
  StackNode *parent_local;
  ostream *os_local;
  StackNode *this_local;
  
  dVar12 = (this->total_runtime / tree_time) * 100.0;
  if (output_threshold <= dVar12) {
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      if ((print_recursive_json::add_comma & 1U) != 0) {
        std::operator<<(os,",\n");
      }
      print_recursive_json::add_comma = true;
      std::operator<<(os,"{\n");
      dVar1 = this->max_runtime;
      dVar2 = this->avg_runtime;
      std::operator<<(os,"\"average-time\" : ");
      poVar9 = (ostream *)std::ostream::operator<<(os,std::scientific);
      _Var7 = std::setprecision(2);
      std::operator<<(poVar9,_Var7);
      poVar9 = (ostream *)std::ostream::operator<<(os,this->avg_runtime);
      std::operator<<(poVar9,",\n");
      poVar9 = (ostream *)std::ostream::operator<<(os,std::fixed);
      _Var7 = std::setprecision(1);
      std::operator<<(poVar9,_Var7);
      dVar3 = this->total_kokkos_runtime;
      dVar4 = this->total_runtime;
      poVar9 = std::operator<<(os,"\"percent\" : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
      std::operator<<(poVar9,",\n");
      poVar9 = std::operator<<(os,"\"percent-kokkos\" : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(dVar3 / dVar4) * 100.0);
      std::operator<<(poVar9,",\n");
      poVar9 = std::operator<<(os,"\"imbalance\" : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(dVar1 / dVar2 - 1.0) * 100.0);
      std::operator<<(poVar9,",\n");
      if (this->kind == STACK_REGION) {
        __range4 = (set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                    *)0x0;
        __end4 = std::
                 set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                 ::begin(&this->children);
        child = (StackNode *)
                std::
                set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                ::end(&this->children);
        while (bVar6 = std::operator!=(&__end4,(_Self *)&child), bVar6) {
          pSVar10 = std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator*
                              (&__end4);
          __range4 = (set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                      *)(pSVar10->total_runtime + (double)__range4);
          std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator++(&__end4);
        }
        dVar12 = this->total_runtime;
        lVar5 = this->total_number_of_kernel_calls;
        dVar1 = this->avg_runtime;
        poVar9 = std::operator<<(os,"\"remainder\" : ");
        poVar9 = (ostream *)
                 std::ostream::operator<<(poVar9,(1.0 - (double)__range4 / dVar12) * 100.0);
        std::operator<<(poVar9,",\n");
        poVar9 = (ostream *)std::ostream::operator<<(os,std::scientific);
        name_escape_double_quote_twices.field_2._12_4_ = std::setprecision(2);
        std::operator<<(poVar9,(_Setprecision)name_escape_double_quote_twices.field_2._12_4_);
        poVar9 = std::operator<<(os,"\"kernels-per-second\" : ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)lVar5 / dVar1);
        std::operator<<(poVar9,",\n");
      }
      else {
        std::operator<<(os,"\"remainder\" : \"N/A\",\n");
        std::operator<<(os,"\"kernels-per-second\" : \"N/A\",\n");
      }
      poVar9 = std::operator<<(os,"\"number-of-calls\" : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->number_of_calls);
      std::operator<<(poVar9,",\n");
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_c8,"\"",0x10);
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &this->name,&local_c8,"\\\"",0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_c8);
      poVar9 = std::operator<<(os,"\"name\" : \"");
      poVar9 = std::operator<<(poVar9,(string *)local_a8);
      std::operator<<(poVar9,"\",\n");
      poVar9 = std::operator<<(os,"\"parent-id\" : \"");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,parent);
      std::operator<<(poVar9,"\",\n");
      poVar9 = std::operator<<(os,"\"id\" : \"");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this);
      std::operator<<(poVar9,"\",\n");
      std::operator<<(os,"\"kernel-type\" : ");
      switch(this->kind) {
      case STACK_FOR:
        std::operator<<(os,"\"for\"");
        break;
      case STACK_REDUCE:
        std::operator<<(os,"\"reduce\"");
        break;
      case STACK_SCAN:
        std::operator<<(os,"\"scan\"");
        break;
      case STACK_REGION:
        std::operator<<(os,"\"region\"");
        break;
      case STACK_COPY:
        std::operator<<(os,"\"copy\"");
      }
      std::operator<<(os,"\n}");
      std::__cxx11::string::~string((string *)local_a8);
    }
    bVar6 = std::
            set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
            ::empty(&this->children);
    if (!bVar6) {
      std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>::allocator
                ((allocator<const_KokkosTools::SpaceTimeStack::StackNode_*> *)((long)&__range2 + 7))
      ;
      std::
      set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
      ::set((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
             *)local_108,
            (anon_class_1_0_00000001_for__M_key_compare *)
            ((long)&children_by_time._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),
            (allocator<const_KokkosTools::SpaceTimeStack::StackNode_*> *)((long)&__range2 + 7));
      std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>::~allocator
                ((allocator<const_KokkosTools::SpaceTimeStack::StackNode_*> *)((long)&__range2 + 7))
      ;
      __end2 = std::
               set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
               ::begin(&this->children);
      child_1 = (StackNode *)
                std::
                set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                ::end(&this->children);
      while (bVar6 = std::operator!=(&__end2,(_Self *)&child_1), bVar6) {
        local_138 = std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator*
                              (&__end2);
        local_130 = local_138;
        std::
        set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
        ::insert((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                  *)local_108,&local_138);
        std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator++(&__end2);
      }
      it = std::
           set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
           ::end((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                  *)local_108);
      std::_Rb_tree_const_iterator<const_KokkosTools::SpaceTimeStack::StackNode_*>::operator--(&it);
      local_158._M_node =
           (_Base_ptr)
           std::
           set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
           ::begin((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                    *)local_108);
      while( true ) {
        child_2 = (StackNode *)
                  std::
                  set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                  ::end((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                         *)local_108);
        bVar6 = std::operator!=(&local_158,(_Self *)&child_2);
        if (!bVar6) break;
        ppSVar11 = std::_Rb_tree_const_iterator<const_KokkosTools::SpaceTimeStack::StackNode_*>::
                   operator*(&local_158);
        print_recursive_json(*ppSVar11,os,this,tree_time);
        std::_Rb_tree_const_iterator<const_KokkosTools::SpaceTimeStack::StackNode_*>::operator++
                  (&local_158);
      }
      std::
      set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
      ::~set((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
              *)local_108);
    }
  }
  return;
}

Assistant:

void print_recursive_json(std::ostream& os, StackNode const* parent,
                            double tree_time) const {
    static bool add_comma = false;
    auto percent          = (total_runtime / tree_time) * 100.0;

    if (percent < output_threshold) return;
    if (!name.empty()) {
      if (add_comma) os << ",\n";
      add_comma = true;
      os << "{\n";
      auto imbalance = (max_runtime / avg_runtime - 1.0) * 100.0;
      os << "\"average-time\" : ";
      os << std::scientific << std::setprecision(2);
      os << avg_runtime << ",\n";
      os << std::fixed << std::setprecision(1);
      auto percent_kokkos = (total_kokkos_runtime / total_runtime) * 100.0;

      os << "\"percent\" : " << percent << ",\n";
      os << "\"percent-kokkos\" : " << percent_kokkos << ",\n";
      os << "\"imbalance\" : " << imbalance << ",\n";

      // Sum over kids if we're a region
      if (kind == STACK_REGION) {
        double child_runtime = 0.0;
        for (auto& child : children) {
          child_runtime += child.total_runtime;
        }
        auto remainder = (1.0 - child_runtime / total_runtime) * 100.0;
        double kps     = total_number_of_kernel_calls / avg_runtime;
        os << "\"remainder\" : " << remainder << ",\n";
        os << std::scientific << std::setprecision(2);
        os << "\"kernels-per-second\" : " << kps << ",\n";
      } else {
        os << "\"remainder\" : \"N/A\",\n";
        os << "\"kernels-per-second\" : \"N/A\",\n";
      }
      os << "\"number-of-calls\" : " << number_of_calls << ",\n";
      auto name_escape_double_quote_twices =
          std::regex_replace(name, std::regex("\""), "\\\"");
      os << "\"name\" : \"" << name_escape_double_quote_twices << "\",\n";
      os << "\"parent-id\" : \"" << parent << "\",\n";
      os << "\"id\" : \"" << this << "\",\n";

      os << "\"kernel-type\" : ";
      switch (kind) {
        case STACK_FOR: os << "\"for\""; break;
        case STACK_REDUCE: os << "\"reduce\""; break;
        case STACK_SCAN: os << "\"scan\""; break;
        case STACK_REGION: os << "\"region\""; break;
        case STACK_COPY: os << "\"copy\""; break;
      };

      os << "\n}";
    }
    if (children.empty()) return;
    auto by_time = [](StackNode const* a, StackNode const* b) {
      if (a->total_runtime != b->total_runtime) {
        return a->total_runtime > b->total_runtime;
      }
      return a->name < b->name;
    };
    std::set<StackNode const*, decltype(by_time)> children_by_time(by_time);
    for (auto& child : children) {
      children_by_time.insert(&child);
    }
    auto last = children_by_time.end();
    --last;
    for (auto it = children_by_time.begin(); it != children_by_time.end();
         ++it) {
      auto child = *it;
      child->print_recursive_json(os, this, tree_time);
    }
  }